

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

int __thiscall CServer::SendMsg(CServer *this,CMsgPacker *pMsg,int Flags,int ClientID)

{
  long lVar1;
  CClient *pCVar2;
  int i;
  long lVar3;
  int iVar4;
  long in_FS_OFFSET;
  CNetChunk Packet;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pMsg == (CMsgPacker *)0x0) {
    iVar4 = -1;
  }
  else {
    if (ClientID != -1) {
      iVar4 = 0;
      if (((0x3f < (uint)ClientID) || (this->m_aClients[(uint)ClientID].m_State == 0)) ||
         (iVar4 = 0, this->m_aClients[(uint)ClientID].m_Quitting != false)) goto LAB_0010c28d;
    }
    mem_zero(&Packet,0x30);
    Packet.m_DataSize = *(int *)&(pMsg->super_CPacker).m_pCurrent - (int)pMsg;
    if ((Flags & 1U) != 0) {
      Packet.m_Flags._0_1_ = (byte)Packet.m_Flags | 1;
    }
    if ((Flags & 2U) != 0) {
      Packet.m_Flags._0_1_ = (byte)Packet.m_Flags | 4;
    }
    Packet.m_ClientID = ClientID;
    Packet.m_pData = pMsg;
    if ((Flags & 4U) == 0) {
      CDemoRecorder::RecordMessage(&this->m_DemoRecorder,pMsg,Packet.m_DataSize);
    }
    iVar4 = 0;
    if ((Flags & 0x10U) == 0) {
      if (ClientID == -1) {
        pCVar2 = this->m_aClients;
        iVar4 = 0;
        for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
          if ((pCVar2->m_State == 5) && (pCVar2->m_Quitting == false)) {
            Packet.m_ClientID = (int)lVar3;
            CNetServer::Send(&this->m_NetServer,&Packet,0xffffffff);
          }
          pCVar2 = pCVar2 + 1;
        }
      }
      else {
        CNetServer::Send(&this->m_NetServer,&Packet,0xffffffff);
      }
    }
  }
LAB_0010c28d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int CServer::SendMsg(CMsgPacker *pMsg, int Flags, int ClientID)
{
	CNetChunk Packet;
	if(!pMsg)
		return -1;

	// drop invalid packet
	if(ClientID != -1 && (ClientID < 0 || ClientID >= MAX_CLIENTS || m_aClients[ClientID].m_State == CClient::STATE_EMPTY || m_aClients[ClientID].m_Quitting))
		return 0;

	mem_zero(&Packet, sizeof(CNetChunk));
	Packet.m_ClientID = ClientID;
	Packet.m_pData = pMsg->Data();
	Packet.m_DataSize = pMsg->Size();

	if(Flags&MSGFLAG_VITAL)
		Packet.m_Flags |= NETSENDFLAG_VITAL;
	if(Flags&MSGFLAG_FLUSH)
		Packet.m_Flags |= NETSENDFLAG_FLUSH;

	// write message to demo recorder
	if(!(Flags&MSGFLAG_NORECORD))
		m_DemoRecorder.RecordMessage(pMsg->Data(), pMsg->Size());

	if(!(Flags&MSGFLAG_NOSEND))
	{
		if(ClientID == -1)
		{
			// broadcast
			int i;
			for(i = 0; i < MAX_CLIENTS; i++)
				if(m_aClients[i].m_State == CClient::STATE_INGAME && !m_aClients[i].m_Quitting)
				{
					Packet.m_ClientID = i;
					m_NetServer.Send(&Packet);
				}
		}
		else
			m_NetServer.Send(&Packet);
	}
	return 0;
}